

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastF64R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  RepeatedField<unsigned_long> *this;
  ushort *puVar7;
  uint *puVar8;
  
  if (data.field_0._0_2_ != 0) {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  this = (RepeatedField<unsigned_long> *)
         ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  uVar1 = *(ushort *)ptr;
  puVar3 = (ushort *)(ptr + 10);
  do {
    puVar7 = puVar3;
    RepeatedField<unsigned_long>::Add(this,*(unsigned_long *)(puVar7 + -4));
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar7) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar8 & 3) != 0) {
          AlignFail(puVar8);
        }
        *puVar8 = *puVar8 | (uint)hasbits;
      }
      return (char *)puVar7;
    }
    uVar2 = *puVar7;
    puVar3 = puVar7 + 5;
  } while (uVar2 == uVar1);
  uVar4 = (uint)table->fast_idx_mask & (uint)uVar2;
  if ((uVar4 & 7) == 0) {
    uVar5 = (ulong)(uVar4 & 0xfffffff8);
    pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                               (msg,puVar7,ctx,
                                (ulong)uVar2 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),table
                                ,hasbits);
    return pcVar6;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastF64R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedFixed<uint64_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}